

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::PrefixUnaryExpressionSyntax::isKind(SyntaxKind kind)

{
  return (bool)((byte)(0x1f7f >> ((byte)(kind - UnaryBitwiseAndExpression) & 0x1f)) &
               kind - UnaryBitwiseAndExpression < 0xd);
}

Assistant:

bool PrefixUnaryExpressionSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::UnaryBitwiseAndExpression:
        case SyntaxKind::UnaryBitwiseNandExpression:
        case SyntaxKind::UnaryBitwiseNorExpression:
        case SyntaxKind::UnaryBitwiseNotExpression:
        case SyntaxKind::UnaryBitwiseOrExpression:
        case SyntaxKind::UnaryBitwiseXnorExpression:
        case SyntaxKind::UnaryBitwiseXorExpression:
        case SyntaxKind::UnaryLogicalNotExpression:
        case SyntaxKind::UnaryMinusExpression:
        case SyntaxKind::UnaryPlusExpression:
        case SyntaxKind::UnaryPredecrementExpression:
        case SyntaxKind::UnaryPreincrementExpression:
            return true;
        default:
            return false;
    }
}